

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O2

int __thiscall
anon_unknown.dwarf_24fa3d::OSScapture::open(OSScapture *this,char *__file,int __oflag,...)

{
  atomic<unsigned_long> __p;
  bool bVar1;
  int iVar2;
  ALuint AVar3;
  ALuint AVar4;
  ALuint AVar5;
  ALCdevice *pAVar6;
  backend_exception *pbVar7;
  ALCchar *pAVar8;
  int *piVar9;
  char *pcVar10;
  long lVar11;
  DevMap *pDVar12;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  _Var13;
  long lVar14;
  __normal_iterator<const_(anonymous_namespace)::DevMap_*,_std::vector<(anonymous_namespace)::DevMap,_al::allocator<(anonymous_namespace)::DevMap,_8UL>_>_>
  __it;
  pointer __file_00;
  int ossFormat;
  ALuint numChannels;
  DevMap *local_70;
  ALCchar *name_local;
  ALuint ossSpeed;
  audio_buf_info info;
  ALuint numFragmentsLogSize;
  __atomic_base<unsigned_long> local_38;
  
  if (__file == (char *)0x0) {
    name_local = "OSS Default";
    __file_00 = (anonymous_namespace)::DefaultCapture_abi_cxx11_;
  }
  else {
    name_local = __file;
    if ((anonymous_namespace)::CaptureDevices == DAT_00229790) {
      ALCossListPopulate((vector<DevMap> *)&(anonymous_namespace)::CaptureDevices,0x10000);
    }
    info._0_8_ = &name_local;
    lVar14 = (long)DAT_00229790 - (long)(anonymous_namespace)::CaptureDevices;
    __it._M_current = (anonymous_namespace)::CaptureDevices;
    local_70 = DAT_00229790;
    for (lVar11 = lVar14 >> 8; _Var13._M_current = __it._M_current, 0 < lVar11; lVar11 = lVar11 + -1
        ) {
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::OSScapture::open(char_const*)::$_0>::operator()
                        ((_Iter_pred<(anonymous_namespace)::OSScapture::open(char_const*)::__0> *)
                         &info,__it);
      if (bVar1) goto LAB_0015d9c9;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::OSScapture::open(char_const*)::$_0>::operator()
                        ((_Iter_pred<(anonymous_namespace)::OSScapture::open(char_const*)::__0> *)
                         &info,__it._M_current + 1);
      _Var13._M_current = __it._M_current + 1;
      if (bVar1) goto LAB_0015d9c9;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::OSScapture::open(char_const*)::$_0>::operator()
                        ((_Iter_pred<(anonymous_namespace)::OSScapture::open(char_const*)::__0> *)
                         &info,__it._M_current + 2);
      _Var13._M_current = __it._M_current + 2;
      if (bVar1) goto LAB_0015d9c9;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::OSScapture::open(char_const*)::$_0>::operator()
                        ((_Iter_pred<(anonymous_namespace)::OSScapture::open(char_const*)::__0> *)
                         &info,__it._M_current + 3);
      _Var13._M_current = __it._M_current + 3;
      if (bVar1) goto LAB_0015d9c9;
      __it._M_current = __it._M_current + 4;
      lVar14 = lVar14 + -0x100;
    }
    lVar14 = lVar14 >> 6;
    pDVar12 = local_70;
    if (lVar14 == 1) {
LAB_0015d9b6:
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::OSScapture::open(char_const*)::$_0>::operator()
                        ((_Iter_pred<(anonymous_namespace)::OSScapture::open(char_const*)::__0> *)
                         &info,__it);
      _Var13._M_current = pDVar12;
      if (bVar1) {
        _Var13._M_current = __it._M_current;
      }
    }
    else if (lVar14 == 2) {
LAB_0015d98e:
      pDVar12 = local_70;
      bVar1 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::OSScapture::open(char_const*)::$_0>::operator()
                        ((_Iter_pred<(anonymous_namespace)::OSScapture::open(char_const*)::__0> *)
                         &info,_Var13);
      if (!bVar1) {
        __it._M_current = _Var13._M_current + 1;
        goto LAB_0015d9b6;
      }
    }
    else {
      _Var13._M_current = local_70;
      if ((lVar14 == 3) &&
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::OSScapture::open(char_const*)::$_0>::operator()
                            ((_Iter_pred<(anonymous_namespace)::OSScapture::open(char_const*)::__0>
                              *)&info,__it), _Var13._M_current = __it._M_current, !bVar1)) {
        _Var13._M_current = __it._M_current + 1;
        goto LAB_0015d98e;
      }
    }
LAB_0015d9c9:
    if (_Var13._M_current == DAT_00229790) {
      pbVar7 = (backend_exception *)__cxa_allocate_exception(0x30);
      al::backend_exception::backend_exception
                (pbVar7,0xa004,"Device name \"%s\" not found",name_local);
      goto LAB_0015ddc2;
    }
    __file_00 = ((_Var13._M_current)->device_name)._M_dataplus._M_p;
  }
  iVar2 = ::open(__file_00,0);
  this->mFd = iVar2;
  if (iVar2 == -1) {
    pbVar7 = (backend_exception *)__cxa_allocate_exception(0x30);
    piVar9 = __errno_location();
    pcVar10 = strerror(*piVar9);
    al::backend_exception::backend_exception
              (pbVar7,0xa004,"Could not open %s: %s",__file_00,pcVar10);
    __cxa_throw(pbVar7,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
  }
  ossFormat = 0;
  pAVar6 = (this->super_BackendBase).mDevice;
  switch(pAVar6->FmtType) {
  case DevFmtByte:
    ossFormat = 0x40;
    break;
  case DevFmtUByte:
    ossFormat = 8;
    break;
  case DevFmtShort:
    ossFormat = 0x10;
    break;
  case DevFmtUShort:
  case DevFmtInt:
  case DevFmtUInt:
  case DevFmtFloat:
    pbVar7 = (backend_exception *)__cxa_allocate_exception(0x30);
    pAVar8 = DevFmtTypeString(((this->super_BackendBase).mDevice)->FmtType);
    al::backend_exception::backend_exception
              (pbVar7,0xa004,"%s capture samples not supported",pAVar8);
    goto LAB_0015ddc2;
  }
  AVar3 = ALCdevice::channelsFromFmt(pAVar6);
  numChannels = AVar3;
  AVar4 = ALCdevice::bytesFromFmt((this->super_BackendBase).mDevice);
  pAVar6 = (this->super_BackendBase).mDevice;
  ossSpeed = pAVar6->Frequency;
  log2i(pAVar6->BufferSize * AVar4 * AVar3 >> 2);
  info.fragments = 0;
  info.fragstotal = 0;
  info.fragsize = 0;
  info.bytes = 0;
  iVar2 = ioctl(this->mFd,0xc004500a);
  if (iVar2 < 0) {
    pbVar7 = (backend_exception *)__cxa_allocate_exception(0x30);
    piVar9 = __errno_location();
    pcVar10 = strerror(*piVar9);
    al::backend_exception::backend_exception
              (pbVar7,0xa004,"ioctl(mFd, SNDCTL_DSP_SETFRAGMENT, &numFragmentsLogSize) failed: %s",
               pcVar10);
  }
  else {
    iVar2 = ioctl(this->mFd,0xc0045005,&ossFormat);
    if (iVar2 < 0) {
      pbVar7 = (backend_exception *)__cxa_allocate_exception(0x30);
      piVar9 = __errno_location();
      pcVar10 = strerror(*piVar9);
      al::backend_exception::backend_exception
                (pbVar7,0xa004,"ioctl(mFd, SNDCTL_DSP_SETFMT, &ossFormat) failed: %s",pcVar10);
    }
    else {
      iVar2 = ioctl(this->mFd,0xc0045006,&numChannels);
      if (iVar2 < 0) {
        pbVar7 = (backend_exception *)__cxa_allocate_exception(0x30);
        piVar9 = __errno_location();
        pcVar10 = strerror(*piVar9);
        al::backend_exception::backend_exception
                  (pbVar7,0xa004,"ioctl(mFd, SNDCTL_DSP_CHANNELS, &numChannels) failed: %s",pcVar10)
        ;
      }
      else {
        iVar2 = ioctl(this->mFd,0xc0045002,&ossSpeed);
        if (iVar2 < 0) {
          pbVar7 = (backend_exception *)__cxa_allocate_exception(0x30);
          piVar9 = __errno_location();
          pcVar10 = strerror(*piVar9);
          al::backend_exception::backend_exception
                    (pbVar7,0xa004,"ioctl(mFd, SNDCTL_DSP_SPEED, &ossSpeed) failed: %s",pcVar10);
        }
        else {
          iVar2 = ioctl(this->mFd,0x8010500d,&info);
          if (iVar2 < 0) {
            pbVar7 = (backend_exception *)__cxa_allocate_exception(0x30);
            piVar9 = __errno_location();
            pcVar10 = strerror(*piVar9);
            al::backend_exception::backend_exception
                      (pbVar7,0xa004,"ioctl(mFd, SNDCTL_DSP_GETISPACE, &info) failed: %s",pcVar10);
          }
          else {
            AVar5 = ALCdevice::channelsFromFmt((this->super_BackendBase).mDevice);
            if (AVar5 == numChannels) {
              if (ossFormat == 8) {
                pAVar6 = (this->super_BackendBase).mDevice;
                if (pAVar6->FmtType == DevFmtUByte) goto LAB_0015db4e;
              }
              else if (ossFormat == 0x10) {
                pAVar6 = (this->super_BackendBase).mDevice;
                if (pAVar6->FmtType == DevFmtShort) goto LAB_0015db4e;
              }
              else if ((ossFormat == 0x40) &&
                      (pAVar6 = (this->super_BackendBase).mDevice, pAVar6->FmtType == DevFmtByte)) {
LAB_0015db4e:
                RingBuffer::Create((RingBuffer *)&stack0xffffffffffffffc8,(ulong)pAVar6->BufferSize,
                                   (ulong)(AVar4 * AVar3),0);
                __p.super___atomic_base<unsigned_long>._M_i =
                     (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_38._M_i;
                local_38._M_i = 0;
                std::__uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>::reset
                          ((__uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_> *)
                           &this->mRing,(pointer)__p.super___atomic_base<unsigned_long>._M_i);
                std::unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_>::~unique_ptr
                          ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)
                           &stack0xffffffffffffffc8);
                iVar2 = std::__cxx11::string::assign
                                  ((char *)&((this->super_BackendBase).mDevice)->DeviceName);
                return iVar2;
              }
              pbVar7 = (backend_exception *)__cxa_allocate_exception(0x30);
              pAVar8 = DevFmtTypeString(((this->super_BackendBase).mDevice)->FmtType);
              al::backend_exception::backend_exception
                        (pbVar7,0xa004,"Failed to set %s samples, got OSS format %#x",pAVar8,
                         (ulong)(uint)ossFormat);
            }
            else {
              pbVar7 = (backend_exception *)__cxa_allocate_exception(0x30);
              pAVar8 = DevFmtChannelsString(((this->super_BackendBase).mDevice)->FmtChans);
              al::backend_exception::backend_exception
                        (pbVar7,0xa004,"Failed to set %s, got %d channels instead",pAVar8,
                         (ulong)numChannels);
            }
          }
        }
      }
    }
  }
LAB_0015ddc2:
  __cxa_throw(pbVar7,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

void OSScapture::open(const ALCchar *name)
{
    const char *devname{DefaultCapture.c_str()};
    if(!name)
        name = DefaultName;
    else
    {
        if(CaptureDevices.empty())
            ALCossListPopulate(CaptureDevices, DSP_CAP_INPUT);

        auto iter = std::find_if(CaptureDevices.cbegin(), CaptureDevices.cend(),
            [&name](const DevMap &entry) -> bool
            { return entry.name == name; }
        );
        if(iter == CaptureDevices.cend())
            throw al::backend_exception{ALC_INVALID_VALUE, "Device name \"%s\" not found", name};
        devname = iter->device_name.c_str();
    }

    mFd = ::open(devname, O_RDONLY);
    if(mFd == -1)
        throw al::backend_exception{ALC_INVALID_VALUE, "Could not open %s: %s", devname,
            strerror(errno)};

    int ossFormat{};
    switch(mDevice->FmtType)
    {
    case DevFmtByte:
        ossFormat = AFMT_S8;
        break;
    case DevFmtUByte:
        ossFormat = AFMT_U8;
        break;
    case DevFmtShort:
        ossFormat = AFMT_S16_NE;
        break;
    case DevFmtUShort:
    case DevFmtInt:
    case DevFmtUInt:
    case DevFmtFloat:
        throw al::backend_exception{ALC_INVALID_VALUE, "%s capture samples not supported",
            DevFmtTypeString(mDevice->FmtType)};
    }

    ALuint periods{4};
    ALuint numChannels{mDevice->channelsFromFmt()};
    ALuint frameSize{numChannels * mDevice->bytesFromFmt()};
    ALuint ossSpeed{mDevice->Frequency};
    /* according to the OSS spec, 16 bytes are the minimum */
    ALuint log2FragmentSize{maxu(log2i(mDevice->BufferSize * frameSize / periods), 4)};
    ALuint numFragmentsLogSize{(periods << 16) | log2FragmentSize};

    audio_buf_info info{};
#define CHECKERR(func) if((func) < 0) {                                       \
    throw al::backend_exception{ALC_INVALID_VALUE, #func " failed: %s", strerror(errno)}; \
}
    CHECKERR(ioctl(mFd, SNDCTL_DSP_SETFRAGMENT, &numFragmentsLogSize));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_SETFMT, &ossFormat));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_CHANNELS, &numChannels));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_SPEED, &ossSpeed));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_GETISPACE, &info));
#undef CHECKERR

    if(mDevice->channelsFromFmt() != numChannels)
        throw al::backend_exception{ALC_INVALID_VALUE,
            "Failed to set %s, got %d channels instead", DevFmtChannelsString(mDevice->FmtChans),
            numChannels};

    if(!((ossFormat == AFMT_S8 && mDevice->FmtType == DevFmtByte)
        || (ossFormat == AFMT_U8 && mDevice->FmtType == DevFmtUByte)
        || (ossFormat == AFMT_S16_NE && mDevice->FmtType == DevFmtShort)))
        throw al::backend_exception{ALC_INVALID_VALUE,
            "Failed to set %s samples, got OSS format %#x", DevFmtTypeString(mDevice->FmtType),
            ossFormat};

    mRing = RingBuffer::Create(mDevice->BufferSize, frameSize, false);

    mDevice->DeviceName = name;
}